

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::withLoc<wasm::Ok>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Result<wasm::Ok> *res)

{
  size_t sVar1;
  Result<wasm::Ok> local_48;
  Result<wasm::Ok> *local_20;
  Result<wasm::Ok> *res_local;
  ParseDefsCtx *this_local;
  
  local_20 = res;
  res_local = (Result<wasm::Ok> *)this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  sVar1 = Lexer::getPos(&this->in);
  Result<wasm::Ok>::Result(&local_48,res);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,(Index)sVar1,&local_48);
  Result<wasm::Ok>::~Result(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<T> withLoc(Result<T> res) {
    return withLoc(in.getPos(), res);
  }